

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DecorationManager::WhileEachDecoration
          (DecorationManager *this,uint32_t id,uint32_t decoration,
          function<bool_(const_spvtools::opt::Instruction_&)> *f)

{
  Instruction *this_00;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  reference ppIVar4;
  Instruction *inst;
  __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
  local_58;
  iterator __end2;
  iterator __begin2;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  *__range2;
  function<bool_(const_spvtools::opt::Instruction_&)> *f_local;
  uint32_t decoration_local;
  uint32_t id_local;
  DecorationManager *this_local;
  
  GetDecorationsFor((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                     *)&__begin2,this,id,true);
  __end2 = std::
           vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           ::begin((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  local_58._M_current =
       (Instruction **)
       std::
       vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
       ::end((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              *)&__begin2);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_58);
    if (!bVar1) {
      inst._4_4_ = 2;
LAB_0033562e:
      std::
      vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ::~vector((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                 *)&__begin2);
      if (inst._4_4_ != 1) {
        this_local._7_1_ = 1;
      }
      return (bool)(this_local._7_1_ & 1);
    }
    ppIVar4 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppIVar4;
    OVar2 = Instruction::opcode(this_00);
    if (OVar2 == OpDecorate) {
LAB_003355ca:
      uVar3 = Instruction::GetSingleWordInOperand(this_00,1);
      if ((uVar3 == decoration) &&
         (bVar1 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()(f,this_00),
         !bVar1)) {
        this_local._7_1_ = 0;
        inst._4_4_ = 1;
        goto LAB_0033562e;
      }
    }
    else {
      if (OVar2 != OpMemberDecorate) {
        if ((OVar2 != OpDecorateId) && (OVar2 != OpDecorateString)) {
          __assert_fail("false && \"Unexpected decoration instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x1e0,
                        "bool spvtools::opt::analysis::DecorationManager::WhileEachDecoration(uint32_t, uint32_t, std::function<bool (const Instruction &)>) const"
                       );
        }
        goto LAB_003355ca;
      }
      uVar3 = Instruction::GetSingleWordInOperand(this_00,2);
      if ((uVar3 == decoration) &&
         (bVar1 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()(f,this_00),
         !bVar1)) {
        this_local._7_1_ = 0;
        inst._4_4_ = 1;
        goto LAB_0033562e;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool DecorationManager::WhileEachDecoration(
    uint32_t id, uint32_t decoration,
    std::function<bool(const Instruction&)> f) const {
  for (const Instruction* inst : GetDecorationsFor(id, true)) {
    switch (inst->opcode()) {
      case spv::Op::OpMemberDecorate:
        if (inst->GetSingleWordInOperand(2) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpDecorateStringGOOGLE:
        if (inst->GetSingleWordInOperand(1) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
  return true;
}